

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O1

void __thiscall OpenMD::UniformGradient::modifyForces(UniformGradient *this)

{
  Mat3x3d *pMVar1;
  double dVar2;
  double dVar3;
  AtomType *pAVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  undefined1 auVar7 [16];
  RealType RVar8;
  double dVar9;
  ulong uVar10;
  Molecule *pMVar11;
  pointer ppAVar12;
  double dVar13;
  bool bVar14;
  bool bVar15;
  uint i_2;
  Molecule *pMVar16;
  Mat3x3d *pMVar17;
  pointer ppAVar18;
  uint i_1;
  long lVar19;
  long lVar20;
  double *pdVar21;
  ulong uVar22;
  uint j;
  Mat3x3d *pMVar23;
  double (*padVar24) [3];
  long lVar25;
  Atom *this_00;
  uint i_4;
  long lVar26;
  double *pdVar27;
  uint i_17;
  uint j_3;
  byte bVar28;
  undefined4 uVar29;
  double tmp;
  undefined4 uVar30;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector3d EF;
  Vector3d f;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d r;
  Vector3d t;
  Vector3d D;
  FluctuatingChargeAdapter fqa;
  Mat3x3d Q;
  RectMatrix<double,_3U,_3U> result_2;
  double local_290;
  double local_288 [4];
  potVec local_268;
  double local_218 [4];
  double local_1f8 [4];
  double local_1d8;
  MultipoleAdapter local_1d0;
  FixedChargeAdapter local_1c8;
  MoleculeIterator local_1c0;
  Vector3d local_1b8;
  double local_198 [4];
  double local_178 [4];
  double (*local_158) [3];
  Molecule *local_150;
  pointer local_148;
  FluctuatingChargeAdapter local_140;
  double local_138 [10];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  potVec local_68;
  
  bVar28 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_1c0._M_node = (_Base_ptr)0x0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_178[2] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_138[8] = 0.0;
  local_138[6] = 0.0;
  local_138[7] = 0.0;
  local_138[4] = 0.0;
  local_138[5] = 0.0;
  local_138[2] = 0.0;
  local_138[3] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_198[2] = 0.0;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_218[2] = 0.0;
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  if (this->doUniformGradient == true) {
    pMVar16 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_1c0);
    if (pMVar16 == (Molecule *)0x0) {
      local_290 = 0.0;
    }
    else {
      pMVar1 = &this->Grad_;
      local_158 = (this->Grad_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                  + 2;
      local_290 = 0.0;
      do {
        ppAVar18 = (pMVar16->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pMVar11 = local_150;
        ppAVar12 = local_148;
        if (ppAVar18 ==
            (pMVar16->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (Atom *)0x0;
        }
        else {
          this_00 = *ppAVar18;
        }
        while (local_150 = pMVar16, local_148 = ppAVar18, this_00 != (Atom *)0x0) {
          pAVar4 = this_00->atomType_;
          lVar20 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (this_00->super_StuntDouble).storage_);
          lVar19 = (long)(this_00->super_StuntDouble).localIndex_;
          pdVar21 = (double *)(lVar20 + lVar19 * 0x18);
          local_1b8.super_Vector<double,_3U>.data_[0] = *pdVar21;
          local_1b8.super_Vector<double,_3U>.data_[1] = pdVar21[1];
          local_1b8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar20 + 0x10 + lVar19 * 0x18);
          Snapshot::wrapVector
                    (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,&local_1b8);
          local_268.data_[0] = 0.0;
          local_268.data_[1] = 0.0;
          local_268.data_[2] = 0.0;
          lVar20 = 0;
          pMVar17 = pMVar1;
          do {
            dVar2 = local_268.data_[lVar20];
            lVar19 = 0;
            do {
              dVar2 = dVar2 + (pMVar17->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][lVar19] *
                              local_1b8.super_Vector<double,_3U>.data_[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_268.data_[lVar20] = dVar2;
            lVar20 = lVar20 + 1;
            pMVar17 = (Mat3x3d *)
                      ((pMVar17->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 1);
          } while (lVar20 != 3);
          local_218[2] = local_268.data_[2];
          local_218[0] = local_268.data_[0];
          local_218[1] = local_268.data_[1];
          local_288[0] = 0.0;
          local_288[1] = 0.0;
          local_288[2] = 0.0;
          lVar20 = 0;
          do {
            local_288[lVar20] = local_218[lVar20] * 23.0609;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          local_268.data_[2] = local_288[2];
          local_268.data_[0] = local_288[0];
          local_268.data_[1] = local_288[1];
          lVar20 = (long)(this_00->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).electricField.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (this_00->super_StuntDouble).storage_);
          lVar19 = 0;
          do {
            *(double *)(lVar20 + lVar19 * 8) =
                 local_268.data_[lVar19] + *(double *)(lVar20 + lVar19 * 8);
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          local_1c8.at_ = pAVar4;
          bVar14 = FixedChargeAdapter::isFixedCharge(&local_1c8);
          uVar29 = 0;
          uVar30 = 0;
          if (bVar14) {
            RVar8 = FixedChargeAdapter::getCharge(&local_1c8);
            uVar29 = SUB84(RVar8,0);
            uVar30 = (undefined4)((ulong)RVar8 >> 0x20);
          }
          local_1d8 = (double)CONCAT44(uVar30,uVar29);
          local_140.at_ = pAVar4;
          bVar15 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_140);
          dVar2 = local_1d8;
          if (bVar15) {
            DVar5 = (this_00->super_StuntDouble).storage_;
            pSVar6 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar20 = (long)(this_00->super_StuntDouble).localIndex_;
            dVar2 = *(double *)
                     (*(long *)((long)&(pSVar6->atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + DVar5) + lVar20 * 8);
            dVar9 = 0.0;
            lVar19 = 0;
            do {
              dVar9 = dVar9 + local_1b8.super_Vector<double,_3U>.data_[lVar19] * local_218[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            lVar19 = *(long *)((long)&(pSVar6->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + DVar5);
            *(double *)(lVar19 + lVar20 * 8) = dVar9 * 23.0609 + *(double *)(lVar19 + lVar20 * 8);
            bVar14 = true;
            dVar2 = local_1d8 + dVar2;
          }
          if (bVar14 != false) {
            local_288[0] = 0.0;
            local_288[1] = 0.0;
            local_288[2] = 0.0;
            lVar20 = 0;
            do {
              local_288[lVar20] = local_218[lVar20] * dVar2;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            local_268.data_[0] = 0.0;
            local_268.data_[1] = 0.0;
            local_268.data_[2] = 0.0;
            lVar20 = 0;
            do {
              local_268.data_[lVar20] = local_288[lVar20] * 23.0609;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            local_1f8[2] = local_268.data_[2];
            local_1f8[0] = local_268.data_[0];
            local_1f8[1] = local_268.data_[1];
            DVar5 = (this_00->super_StuntDouble).storage_;
            pSVar6 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar20 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar19 = lVar20 * 0x18 +
                     *(long *)((long)&(pSVar6->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar5);
            lVar26 = 0;
            do {
              *(double *)(lVar19 + lVar26 * 8) =
                   local_1f8[lVar26] + *(double *)(lVar19 + lVar26 * 8);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            dVar2 = 0.0;
            lVar19 = 0;
            do {
              dVar2 = dVar2 + local_1b8.super_Vector<double,_3U>.data_[lVar19] * local_1f8[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (this->doParticlePot == true) {
              lVar19 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar5);
              *(double *)(lVar19 + lVar20 * 8) = *(double *)(lVar19 + lVar20 * 8) - dVar2;
            }
            local_290 = local_290 - dVar2;
          }
          local_1d0.at_ = pAVar4;
          bVar14 = MultipoleAdapter::isDipole(&local_1d0);
          if (bVar14) {
            lVar19 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar20 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).dipole.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (this_00->super_StuntDouble).storage_);
            local_288[2] = *(double *)(lVar20 + 0x10 + lVar19 * 0x18);
            pdVar21 = (double *)(lVar20 + lVar19 * 0x18);
            local_288[0] = *pdVar21;
            local_288[1] = pdVar21[1];
            local_268.data_[0] = 0.0;
            local_268.data_[1] = 0.0;
            local_268.data_[2] = 0.0;
            lVar20 = 0;
            do {
              local_268.data_[lVar20] = local_288[lVar20] * 4.8018969509;
              dVar13 = local_268.data_[2];
              dVar9 = local_268.data_[1];
              dVar2 = local_268.data_[0];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            local_178[2] = local_268.data_[2];
            local_178[0] = local_268.data_[0];
            local_178[1] = local_268.data_[1];
            local_268.data_[0] = 0.0;
            local_268.data_[1] = 0.0;
            local_268.data_[2] = 0.0;
            lVar20 = 0;
            pMVar17 = pMVar1;
            do {
              dVar3 = local_268.data_[lVar20];
              lVar19 = 0;
              pMVar23 = pMVar17;
              do {
                dVar3 = dVar3 + local_178[lVar19] *
                                (pMVar23->super_SquareMatrix<double,_3>).
                                super_RectMatrix<double,_3U,_3U>.data_[0][0];
                lVar19 = lVar19 + 1;
                pMVar23 = (Mat3x3d *)
                          ((pMVar23->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_ + 1);
              } while (lVar19 != 3);
              local_268.data_[lVar20] = dVar3;
              lVar20 = lVar20 + 1;
              pMVar17 = (Mat3x3d *)
                        ((pMVar17->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_[0] + 1);
            } while (lVar20 != 3);
            local_1f8[2] = local_268.data_[2];
            local_1f8[0] = local_268.data_[0];
            local_1f8[1] = local_268.data_[1];
            lVar20 = (long)(this_00->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (this_00->super_StuntDouble).storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar20 + lVar19 * 8) =
                   local_1f8[lVar19] + *(double *)(lVar20 + lVar19 * 8);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_198[0] = local_218[2] * dVar9 - dVar13 * local_218[1];
            local_198[1] = local_218[0] * dVar13 - dVar2 * local_218[2];
            local_198[2] = dVar2 * local_218[1] - local_218[0] * dVar9;
            DVar5 = (this_00->super_StuntDouble).storage_;
            pSVar6 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar20 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar19 = lVar20 * 0x18 +
                     *(long *)((long)&(pSVar6->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar5);
            lVar26 = 0;
            do {
              *(double *)(lVar19 + lVar26 * 8) =
                   local_198[lVar26] + *(double *)(lVar19 + lVar26 * 8);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            dVar2 = 0.0;
            lVar19 = 0;
            do {
              dVar2 = dVar2 + local_178[lVar19] * local_218[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (this->doParticlePot == true) {
              lVar19 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar5);
              *(double *)(lVar19 + lVar20 * 8) = *(double *)(lVar19 + lVar20 * 8) - dVar2;
            }
            local_290 = local_290 - dVar2;
          }
          bVar14 = MultipoleAdapter::isQuadrupole(&local_1d0);
          if (bVar14) {
            padVar24 = (double (*) [3])local_268.data_;
            StuntDouble::getQuadrupole((Mat3x3d *)padVar24,&this_00->super_StuntDouble);
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_a8 = 0;
            uStack_a0 = 0;
            local_b8 = 0.0;
            uStack_b0 = 0;
            local_78 = 0;
            pdVar21 = &local_b8;
            lVar20 = 0;
            do {
              lVar19 = 0;
              do {
                pdVar21[lVar19] =
                     (((SquareMatrix<double,_3> *)*padVar24)->super_RectMatrix<double,_3U,_3U>).
                     data_[0][lVar19] * 4.8018969509;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              lVar20 = lVar20 + 1;
              pdVar21 = pdVar21 + 3;
              padVar24 = padVar24 + 1;
            } while (lVar20 != 3);
            pdVar21 = &local_b8;
            pdVar27 = local_138;
            for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
              *pdVar27 = *pdVar21;
              pdVar21 = pdVar21 + (ulong)bVar28 * -2 + 1;
              pdVar27 = pdVar27 + (ulong)bVar28 * -2 + 1;
            }
            local_288[0] = 0.0;
            local_288[1] = 0.0;
            local_288[2] = 0.0;
            uVar22 = 2;
            pdVar21 = local_138 + 6;
            padVar24 = local_158;
            lVar20 = 0;
            do {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar22;
              uVar10 = SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe;
              lVar19 = lVar20 + 1;
              lVar26 = lVar19;
              if (lVar19 == 3) {
                lVar26 = 0;
              }
              dVar2 = local_288[lVar20];
              lVar25 = 0;
              do {
                dVar2 = dVar2 + (*(double *)((long)local_138 + lVar25 + lVar26 * 0x18) *
                                 *(double *)((long)padVar24 + lVar25 + uVar10 * -0x24) -
                                *(double *)
                                 ((long)(pMVar1->super_SquareMatrix<double,_3>).
                                        super_RectMatrix<double,_3U,_3U>.data_[lVar26] + lVar25) *
                                *(double *)((long)pdVar21 + lVar25 + uVar10 * -0x24));
                lVar25 = lVar25 + 8;
              } while (lVar25 != 0x18);
              local_288[lVar20] = dVar2;
              pdVar21 = pdVar21 + 3;
              uVar22 = uVar22 + 1;
              padVar24 = padVar24 + 1;
              lVar20 = lVar19;
            } while (lVar19 != 3);
            local_268.data_[0] = 0.0;
            local_268.data_[1] = 0.0;
            local_268.data_[2] = 0.0;
            lVar20 = 0;
            do {
              local_268.data_[lVar20] = local_288[lVar20] + local_288[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
            local_198[2] = local_268.data_[2];
            local_198[0] = local_268.data_[0];
            local_198[1] = local_268.data_[1];
            DVar5 = (this_00->super_StuntDouble).storage_;
            pSVar6 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar20 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar19 = lVar20 * 0x18 +
                     *(long *)((long)&(pSVar6->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar5);
            lVar26 = 0;
            do {
              *(double *)(lVar19 + lVar26 * 8) =
                   local_198[lVar26] + *(double *)(lVar19 + lVar26 * 8);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            dVar2 = 0.0;
            pdVar21 = local_138;
            lVar19 = 0;
            pMVar17 = pMVar1;
            do {
              lVar26 = 0;
              do {
                dVar2 = dVar2 + pdVar21[lVar26] *
                                (pMVar17->super_SquareMatrix<double,_3>).
                                super_RectMatrix<double,_3U,_3U>.data_[0][lVar26];
                lVar26 = lVar26 + 1;
              } while (lVar26 != 3);
              lVar19 = lVar19 + 1;
              pMVar17 = (Mat3x3d *)
                        ((pMVar17->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
              pdVar21 = pdVar21 + 3;
            } while (lVar19 != 3);
            if (this->doParticlePot == true) {
              lVar19 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar5);
              *(double *)(lVar19 + lVar20 * 8) = *(double *)(lVar19 + lVar20 * 8) - dVar2;
            }
            local_290 = local_290 - dVar2;
          }
          ppAVar18 = local_148 + 1;
          pMVar16 = local_150;
          pMVar11 = local_150;
          ppAVar12 = local_148;
          if (ppAVar18 ==
              (local_150->atoms_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = (Atom *)0x0;
          }
          else {
            this_00 = *ppAVar18;
          }
        }
        local_150 = pMVar11;
        local_148 = ppAVar12;
        pMVar16 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_1c0);
      } while (pMVar16 != (Molecule *)0x0);
    }
    pSVar6 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_268,pSVar6);
    local_c8 = local_268.data_[0];
    dStack_c0 = local_268.data_[1];
    local_d8 = local_268.data_[5];
    dStack_d0 = local_268.data_[6];
    local_e8 = local_268.data_[3];
    dStack_e0 = local_268.data_[4];
    local_68.data_[2] = local_290 + local_268.data_[2];
    local_68.data_[0] = local_268.data_[0];
    local_68.data_[1] = local_268.data_[1];
    local_68.data_[3] = local_268.data_[3];
    local_68.data_[4] = local_268.data_[4];
    local_68.data_[5] = local_268.data_[5];
    local_68.data_[6] = local_268.data_[6];
    Snapshot::setLongRangePotentials(pSVar6,&local_68);
  }
  return;
}

Assistant:

void UniformGradient::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    Mat3x3d Q;

    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;

    Vector3d r;
    Vector3d EF;

    bool isCharge;

    if (doUniformGradient) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          EF = Grad_ * r;

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);

            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            f = D * Grad_;
            atom->addFrc(f);

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          if (ma.isQuadrupole()) {
            Q = atom->getQuadrupole() * Constants::dipoleFieldConvert;

            t = 2.0 * mCross(Q, Grad_);
            atom->addTrq(t);

            U = -doubleDot(Q, Grad_);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }